

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O2

void hedg::stream::authenticate_msg(streambuf *request,stream_authenticate *p)

{
  ostream *poVar1;
  ostream request_stream;
  ostream local_120 [8];
  ios_base local_118 [264];
  
  std::ostream::ostream(local_120,&request->super_streambuf);
  poVar1 = std::operator<<((ostream *)local_120,"{\"op\":\"authentication\",\"id\":1,\"appKey\":\"")
  ;
  poVar1 = std::operator<<(poVar1,(string *)config::app_key_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"\",\"session\":\"");
  poVar1 = std::operator<<(poVar1,(string *)p);
  std::operator<<(poVar1,"\"}");
  std::operator<<((ostream *)local_120,"\r\n");
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void authenticate_msg(boost::asio::streambuf& request, params::stream_authenticate p) {
		std::ostream request_stream(&request);
		request_stream << "{\"op\":\"authentication\",\"id\":1,\"appKey\":\"" << config::app_key << "\","
			"\"session\":\"" << p.session_id << "\"}";
		request_stream << "\r\n";
	}